

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O1

iterator __thiscall
threadsafe::ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link>::erase
          (ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link> *this,iterator *start,iterator *end
          )

{
  Node<sig::ProtoSignal<void_(bool,_int)>::Link> *this_00;
  long *in_RCX;
  node_pointer_type this_01;
  undefined8 local_38;
  
  this_01 = end->node_;
  if (this_01 != (node_pointer_type)*in_RCX) {
    do {
      impl::Node<sig::ProtoSignal<void_(bool,_int)>::Link>::inc_ref(this_01);
      this_00 = end->node_;
      erase((ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link> *)&stack0xffffffffffffffc8,start)
      ;
      impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::operator=
                (end,(Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> *)
                     &stack0xffffffffffffffc8);
      if ((Node<sig::ProtoSignal<void_(bool,_int)>::Link> *)local_38 !=
          (Node<sig::ProtoSignal<void_(bool,_int)>::Link> *)0x0) {
        impl::Node<sig::ProtoSignal<void_(bool,_int)>::Link>::dec_ref
                  ((Node<sig::ProtoSignal<void_(bool,_int)>::Link> *)local_38);
      }
      if (this_00 != (Node<sig::ProtoSignal<void_(bool,_int)>::Link> *)0x0) {
        impl::Node<sig::ProtoSignal<void_(bool,_int)>::Link>::dec_ref(this_00);
      }
      this_01 = end->node_;
    } while (this_01 != (node_pointer_type)*in_RCX);
  }
  *(undefined8 *)&(this->root_).val.func.super__Function_base._M_functor = 0;
  impl::Node<sig::ProtoSignal<void_(bool,_int)>::Link>::inc_ref(this_01);
  *(node_pointer_type *)&(this->root_).val.func.super__Function_base._M_functor = end->node_;
  return (iterator)&this->root_;
}

Assistant:

iterator erase(iterator start, iterator end) {
        for(; start != end;) {
            start = erase(start);
        }
        return start;
    }